

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * decExpOp(decNumber *res,decNumber *rhs,decContext *set,uint32_t *status)

{
  uint32_t uVar1;
  bool bVar2;
  int32_t iVar3;
  uint local_2c8;
  uint local_2c4;
  uint32_t local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint32_t local_2b4;
  int local_2b0;
  int32_t n;
  int32_t i;
  int32_t seenbit;
  decNumber *newrhs;
  int32_t use;
  int32_t lever;
  int32_t maxlever;
  int32_t shift;
  decNumber numone;
  decNumber *d;
  decNumber bufd [3];
  decNumber *local_248;
  decNumber *a;
  decNumber *allocbufa;
  decNumber bufa [15];
  decNumber *local_178;
  decNumber *t;
  decNumber *allocbuft;
  decNumber buft [8];
  decNumber *local_100;
  decNumber *allocrhs;
  decNumber bufr [7];
  undefined1 auStack_9c [4];
  int32_t comp;
  decContext dset;
  decContext tset;
  decContext aset;
  decNumber *x;
  int32_t local_38;
  uint32_t needbytes;
  int32_t residue;
  int32_t p;
  int32_t h;
  uint32_t ignore;
  uint32_t *status_local;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *res_local;
  
  p = 0;
  local_100 = (decNumber *)0x0;
  t = (decNumber *)0x0;
  local_178 = (decNumber *)&allocbuft;
  a = (decNumber *)0x0;
  local_248 = (decNumber *)&allocbufa;
  numone._4_8_ = &d;
  _h = status;
  status_local = (uint32_t *)set;
  set_local = (decContext *)rhs;
  rhs_local = res;
  if ((rhs->bits & 0x70) == 0) {
    if (((rhs->lsu[0] == '\0') && (rhs->digits == 1)) && ((rhs->bits & 0x70) == 0)) {
      uprv_decNumberZero_63(res);
      rhs_local->lsu[0] = '\x01';
    }
    else {
      uprv_decNumberZero_63((decNumber *)numone._4_8_);
      *(undefined1 *)(numone._4_8_ + 9) = 4;
      *(uint32_t *)(numone._4_8_ + 4) = -*status_local;
      if ((set_local->emin & 0x80) != 0) {
        *(int *)(numone._4_8_ + 4) = *(int *)(numone._4_8_ + 4) + -1;
      }
      bufr[6]._8_4_ = decCompare((decNumber *)numone._4_8_,(decNumber *)set_local,'\x01');
      if (bufr[6]._8_4_ == -0x80000000) {
        *_h = *_h | 0x10;
      }
      else if ((int)bufr[6]._8_4_ < 0) {
        uprv_decContextDefault_63((decContext *)&tset.status,0x40);
        tset._24_4_ = status_local[1];
        residue = set_local->emax + set_local->digits;
        if (residue < 9) {
          local_2b8 = (uint)(8 < set_local->digits);
          if (8 - residue <= (int)local_2b8) {
            local_2b8 = 8 - residue;
          }
          newrhs._4_4_ = -local_2b8 - set_local->digits;
          residue = local_2b8 + residue;
          if (residue < 0) {
            newrhs._4_4_ = residue + newrhs._4_4_;
            residue = 0;
          }
          aset._20_8_ = rhs;
          if (set_local->emax != newrhs._4_4_) {
            _i = (decNumber *)&allocrhs;
            if (set_local->digits < 0x32) {
              local_2bc = (uint)""[set_local->digits];
            }
            else {
              local_2bc = set_local->digits / 1;
            }
            if ((0x54 < local_2bc + 0xb) &&
               (_i = (decNumber *)uprv_malloc_63((ulong)(local_2bc + 0xb)), local_100 = _i,
               _i == (decNumber *)0x0)) {
              *_h = *_h | 0x10;
              goto LAB_002c0816;
            }
            uprv_decNumberCopy_63(_i,(decNumber *)set_local);
            _i->exponent = newrhs._4_4_;
            aset._20_8_ = _i;
          }
          if (*(int *)aset._20_8_ < (int)*status_local) {
            local_2c0 = *status_local;
          }
          else {
            local_2c0 = *(uint32_t *)aset._20_8_;
          }
          needbytes = local_2c0 + residue + 2;
          if ((int)(needbytes * 2) < 0x32) {
            local_2c4 = (uint)""[(int)(needbytes * 2)];
          }
          else {
            local_2c4 = (int)(needbytes * 2) / 1;
          }
          if ((0xb4 < local_2c4 + 0xb) &&
             (local_248 = (decNumber *)uprv_malloc_63((ulong)(local_2c4 + 0xb)), a = local_248,
             local_248 == (decNumber *)0x0)) {
            *_h = *_h | 0x10;
            goto LAB_002c0816;
          }
          if ((int)(needbytes + 2) < 0x32) {
            local_2c8 = (uint)""[(int)(needbytes + 2)];
          }
          else {
            local_2c8 = (int)(needbytes + 2) / 1;
          }
          if ((0x60 < local_2c8 + 0xb) &&
             (local_178 = (decNumber *)uprv_malloc_63((ulong)(local_2c8 + 0xb)), t = local_178,
             local_178 == (decNumber *)0x0)) {
            *_h = *_h | 0x10;
            goto LAB_002c0816;
          }
          uprv_decNumberCopy_63(local_178,(decNumber *)aset._20_8_);
          uprv_decNumberZero_63(local_248);
          local_248->lsu[0] = '\x01';
          uprv_decNumberZero_63((decNumber *)numone._4_8_);
          *(undefined1 *)(numone._4_8_ + 9) = 2;
          uprv_decNumberZero_63((decNumber *)&maxlever);
          numone.digits._1_1_ = 1;
          uprv_decContextDefault_63((decContext *)&dset.status,0x40);
          dset.emin = tset.emin;
          dset.round = tset.round;
          dset.traps = tset.traps;
          tset.status = needbytes << 1;
          dset.status = needbytes;
          tset.digits = -999999999;
          while( true ) {
            decAddOp(local_248,local_248,local_178,(decContext *)&tset.status,'\0',_h);
            decMultiplyOp(local_178,local_178,(decNumber *)aset._20_8_,(decContext *)&dset.status,
                          (uint32_t *)&p);
            decDivideOp(local_178,local_178,(decNumber *)numone._4_8_,(decContext *)&dset.status,
                        0x80,(uint32_t *)&p);
            if (((int)(local_178->digits + local_178->exponent + needbytes + 1) <=
                 local_248->digits + local_248->exponent) && ((int)needbytes <= local_248->digits))
            break;
            decAddOp((decNumber *)numone._4_8_,(decNumber *)numone._4_8_,(decNumber *)&maxlever,
                     (decContext *)auStack_9c,'\0',(uint32_t *)&p);
          }
        }
        else {
          uprv_decNumberZero_63(local_248);
          bufa[0].digits._1_1_ = 2;
          if ((set_local->emin & 0x80) != 0) {
            allocbufa._4_4_ = 0xfffffffe;
          }
          residue = 8;
          needbytes = 9;
        }
        if (0 < residue) {
          bVar2 = false;
          local_2b4 = DECPOWERS[residue];
          tset.status = needbytes + 2;
          uprv_decNumberZero_63(local_178);
          local_178->lsu[0] = '\x01';
          local_2b0 = 1;
          while (((*_h & 0x2200) == 0 ||
                 (((*_h & 0x200) == 0 &&
                  (((local_178->lsu[0] != '\0' || (local_178->digits != 1)) ||
                   ((local_178->bits & 0x70) != 0))))))) {
            local_2b4 = local_2b4 << 1;
            if ((int)local_2b4 < 0) {
              bVar2 = true;
              decMultiplyOp(local_178,local_178,local_248,(decContext *)&tset.status,_h);
            }
            if (local_2b0 == 0x1f) break;
            if (bVar2) {
              decMultiplyOp(local_178,local_178,local_178,(decContext *)&tset.status,_h);
            }
            local_2b0 = local_2b0 + 1;
          }
          local_248 = local_178;
        }
        local_38 = 1;
        if (((local_248->lsu[0] == '\0') && (local_248->digits == 1)) &&
           ((local_248->bits & 0x70) == 0)) {
          local_38 = 0;
        }
        tset.status = *status_local;
        decCopyFit(rhs_local,local_248,(decContext *)&tset.status,&local_38,_h);
        decFinalize(rhs_local,(decContext *)status_local,&local_38,_h);
      }
      else {
        uVar1 = *status_local;
        uprv_decNumberZero_63(rhs_local);
        rhs_local->lsu[0] = '\x01';
        iVar3 = decShiftToMost(rhs_local->lsu,1,uVar1 - 1);
        rhs_local->digits = iVar3;
        rhs_local->exponent = -(uVar1 - 1);
        *_h = *_h | 0x820;
      }
    }
  }
  else if ((rhs->bits & 0x40) == 0) {
    decNaNs(res,rhs,(decNumber *)0x0,set,status);
  }
  else if ((rhs->bits & 0x80) == 0) {
    uprv_decNumberCopy_63(res,rhs);
  }
  else {
    uprv_decNumberZero_63(res);
  }
LAB_002c0816:
  if (local_100 != (decNumber *)0x0) {
    uprv_free_63(local_100);
  }
  if (a != (decNumber *)0x0) {
    uprv_free_63(a);
  }
  if (t != (decNumber *)0x0) {
    uprv_free_63(t);
  }
  return rhs_local;
}

Assistant:

decNumber * decExpOp(decNumber *res, const decNumber *rhs,
                         decContext *set, uInt *status) {
  uInt ignore=0;                   /* working status  */
  Int h;                           /* adjusted exponent for 0.xxxx  */
  Int p;                           /* working precision  */
  Int residue;                     /* rounding residue  */
  uInt needbytes;                  /* for space calculations  */
  const decNumber *x=rhs;          /* (may point to safe copy later)  */
  decContext aset, tset, dset;     /* working contexts  */
  Int comp;                        /* work  */

  /* the argument is often copied to normalize it, so (unusually) it  */
  /* is treated like other buffers, using DECBUFFER, +1 in case  */
  /* DECBUFFER is 0  */
  decNumber bufr[D2N(DECBUFFER*2+1)];
  decNumber *allocrhs=NULL;        /* non-NULL if rhs buffer allocated  */

  /* the working precision will be no more than set->digits+8+1  */
  /* so for on-stack buffers DECBUFFER+9 is used, +1 in case DECBUFFER  */
  /* is 0 (and twice that for the accumulator)  */

  /* buffer for t, term (working precision plus)  */
  decNumber buft[D2N(DECBUFFER*2+9+1)];
  decNumber *allocbuft=NULL;       /* -> allocated buft, iff allocated  */
  decNumber *t=buft;               /* term  */
  /* buffer for a, accumulator (working precision * 2), at least 9  */
  decNumber bufa[D2N(DECBUFFER*4+18+1)];
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber *a=bufa;               /* accumulator  */
  /* decNumber for the divisor term; this needs at most 9 digits  */
  /* and so can be fixed size [16 so can use standard context]  */
  decNumber bufd[D2N(16)];
  decNumber *d=bufd;               /* divisor  */
  decNumber numone;                /* constant 1  */

  #if DECCHECK
  Int iterations=0;                /* for later sanity check  */
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  do {                                  /* protect allocated storage  */
    if (SPECIALARG) {                   /* handle infinities and NaNs  */
      if (decNumberIsInfinite(rhs)) {   /* an infinity  */
        if (decNumberIsNegative(rhs))   /* -Infinity -> +0  */
          uprv_decNumberZero(res);
         else uprv_decNumberCopy(res, rhs);  /* +Infinity -> self  */
        }
       else decNaNs(res, rhs, NULL, set, status); /* a NaN  */
      break;}

    if (ISZERO(rhs)) {                  /* zeros -> exact 1  */
      uprv_decNumberZero(res);               /* make clean 1  */
      *res->lsu=1;                      /* ..  */
      break;}                           /* [no status to set]  */

    /* e**x when 0 < x < 0.66 is < 1+3x/2, hence can fast-path  */
    /* positive and negative tiny cases which will result in inexact  */
    /* 1.  This also allows the later add-accumulate to always be  */
    /* exact (because its length will never be more than twice the  */
    /* working precision).  */
    /* The comparator (tiny) needs just one digit, so use the  */
    /* decNumber d for it (reused as the divisor, etc., below); its  */
    /* exponent is such that if x is positive it will have  */
    /* set->digits-1 zeros between the decimal point and the digit,  */
    /* which is 4, and if x is negative one more zero there as the  */
    /* more precise result will be of the form 0.9999999 rather than  */
    /* 1.0000001.  Hence, tiny will be 0.0000004  if digits=7 and x>0  */
    /* or 0.00000004 if digits=7 and x<0.  If RHS not larger than  */
    /* this then the result will be 1.000000  */
    uprv_decNumberZero(d);                   /* clean  */
    *d->lsu=4;                          /* set 4 ..  */
    d->exponent=-set->digits;           /* * 10**(-d)  */
    if (decNumberIsNegative(rhs)) d->exponent--;  /* negative case  */
    comp=decCompare(d, rhs, 1);         /* signless compare  */
    if (comp==BADINT) {
      *status|=DEC_Insufficient_storage;
      break;}
    if (comp>=0) {                      /* rhs < d  */
      Int shift=set->digits-1;
      uprv_decNumberZero(res);               /* set 1  */
      *res->lsu=1;                      /* ..  */
      res->digits=decShiftToMost(res->lsu, 1, shift);
      res->exponent=-shift;                  /* make 1.0000...  */
      *status|=DEC_Inexact | DEC_Rounded;    /* .. inexactly  */
      break;} /* tiny  */

    /* set up the context to be used for calculating a, as this is  */
    /* used on both paths below  */
    uprv_decContextDefault(&aset, DEC_INIT_DECIMAL64);
    /* accumulator bounds are as requested (could underflow)  */
    aset.emax=set->emax;                /* usual bounds  */
    aset.emin=set->emin;                /* ..  */
    aset.clamp=0;                       /* and no concrete format  */

    /* calculate the adjusted (Hull & Abrham) exponent (where the  */
    /* decimal point is just to the left of the coefficient msd)  */
    h=rhs->exponent+rhs->digits;
    /* if h>8 then 10**h cannot be calculated safely; however, when  */
    /* h=8 then exp(|rhs|) will be at least exp(1E+7) which is at  */
    /* least 6.59E+4342944, so (due to the restriction on Emax/Emin)  */
    /* overflow (or underflow to 0) is guaranteed -- so this case can  */
    /* be handled by simply forcing the appropriate excess  */
    if (h>8) {                          /* overflow/underflow  */
      /* set up here so Power call below will over or underflow to  */
      /* zero; set accumulator to either 2 or 0.02  */
      /* [stack buffer for a is always big enough for this]  */
      uprv_decNumberZero(a);
      *a->lsu=2;                        /* not 1 but < exp(1)  */
      if (decNumberIsNegative(rhs)) a->exponent=-2; /* make 0.02  */
      h=8;                              /* clamp so 10**h computable  */
      p=9;                              /* set a working precision  */
      }
     else {                             /* h<=8  */
      Int maxlever=(rhs->digits>8?1:0);
      /* [could/should increase this for precisions >40 or so, too]  */

      /* if h is 8, cannot normalize to a lower upper limit because  */
      /* the final result will not be computable (see notes above),  */
      /* but leverage can be applied whenever h is less than 8.  */
      /* Apply as much as possible, up to a MAXLEVER digits, which  */
      /* sets the tradeoff against the cost of the later a**(10**h).  */
      /* As h is increased, the working precision below also  */
      /* increases to compensate for the "constant digits at the  */
      /* front" effect.  */
      Int lever=MINI(8-h, maxlever);    /* leverage attainable  */
      Int use=-rhs->digits-lever;       /* exponent to use for RHS  */
      h+=lever;                         /* apply leverage selected  */
      if (h<0) {                        /* clamp  */
        use+=h;                         /* [may end up subnormal]  */
        h=0;
        }
      /* Take a copy of RHS if it needs normalization (true whenever x>=1)  */
      if (rhs->exponent!=use) {
        decNumber *newrhs=bufr;         /* assume will fit on stack  */
        needbytes=sizeof(decNumber)+(D2U(rhs->digits)-1)*sizeof(Unit);
        if (needbytes>sizeof(bufr)) {   /* need malloc space  */
          allocrhs=(decNumber *)malloc(needbytes);
          if (allocrhs==NULL) {         /* hopeless -- abandon  */
            *status|=DEC_Insufficient_storage;
            break;}
          newrhs=allocrhs;              /* use the allocated space  */
          }
        uprv_decNumberCopy(newrhs, rhs);     /* copy to safe space  */
        newrhs->exponent=use;           /* normalize; now <1  */
        x=newrhs;                       /* ready for use  */
        /* decNumberShow(x);  */
        }

      /* Now use the usual power series to evaluate exp(x).  The  */
      /* series starts as 1 + x + x^2/2 ... so prime ready for the  */
      /* third term by setting the term variable t=x, the accumulator  */
      /* a=1, and the divisor d=2.  */

      /* First determine the working precision.  From Hull & Abrham  */
      /* this is set->digits+h+2.  However, if x is 'over-precise' we  */
      /* need to allow for all its digits to potentially participate  */
      /* (consider an x where all the excess digits are 9s) so in  */
      /* this case use x->digits+h+2  */
      p=MAXI(x->digits, set->digits)+h+2;    /* [h<=8]  */

      /* a and t are variable precision, and depend on p, so space  */
      /* must be allocated for them if necessary  */

      /* the accumulator needs to be able to hold 2p digits so that  */
      /* the additions on the second and subsequent iterations are  */
      /* sufficiently exact.  */
      needbytes=sizeof(decNumber)+(D2U(p*2)-1)*sizeof(Unit);
      if (needbytes>sizeof(bufa)) {     /* need malloc space  */
        allocbufa=(decNumber *)malloc(needbytes);
        if (allocbufa==NULL) {          /* hopeless -- abandon  */
          *status|=DEC_Insufficient_storage;
          break;}
        a=allocbufa;                    /* use the allocated space  */
        }
      /* the term needs to be able to hold p digits (which is  */
      /* guaranteed to be larger than x->digits, so the initial copy  */
      /* is safe); it may also be used for the raise-to-power  */
      /* calculation below, which needs an extra two digits  */
      needbytes=sizeof(decNumber)+(D2U(p+2)-1)*sizeof(Unit);
      if (needbytes>sizeof(buft)) {     /* need malloc space  */
        allocbuft=(decNumber *)malloc(needbytes);
        if (allocbuft==NULL) {          /* hopeless -- abandon  */
          *status|=DEC_Insufficient_storage;
          break;}
        t=allocbuft;                    /* use the allocated space  */
        }

      uprv_decNumberCopy(t, x);              /* term=x  */
      uprv_decNumberZero(a); *a->lsu=1;      /* accumulator=1  */
      uprv_decNumberZero(d); *d->lsu=2;      /* divisor=2  */
      uprv_decNumberZero(&numone); *numone.lsu=1; /* constant 1 for increment  */

      /* set up the contexts for calculating a, t, and d  */
      uprv_decContextDefault(&tset, DEC_INIT_DECIMAL64);
      dset=tset;
      /* accumulator bounds are set above, set precision now  */
      aset.digits=p*2;                  /* double  */
      /* term bounds avoid any underflow or overflow  */
      tset.digits=p;
      tset.emin=DEC_MIN_EMIN;           /* [emax is plenty]  */
      /* [dset.digits=16, etc., are sufficient]  */

      /* finally ready to roll  */
      for (;;) {
        #if DECCHECK
        iterations++;
        #endif
        /* only the status from the accumulation is interesting  */
        /* [but it should remain unchanged after first add]  */
        decAddOp(a, a, t, &aset, 0, status);           /* a=a+t  */
        decMultiplyOp(t, t, x, &tset, &ignore);        /* t=t*x  */
        decDivideOp(t, t, d, &tset, DIVIDE, &ignore);  /* t=t/d  */
        /* the iteration ends when the term cannot affect the result,  */
        /* if rounded to p digits, which is when its value is smaller  */
        /* than the accumulator by p+1 digits.  There must also be  */
        /* full precision in a.  */
        if (((a->digits+a->exponent)>=(t->digits+t->exponent+p+1))
            && (a->digits>=p)) break;
        decAddOp(d, d, &numone, &dset, 0, &ignore);    /* d=d+1  */
        } /* iterate  */

      #if DECCHECK
      /* just a sanity check; comment out test to show always  */
      if (iterations>p+3)
        printf("Exp iterations=%ld, status=%08lx, p=%ld, d=%ld\n",
               (LI)iterations, (LI)*status, (LI)p, (LI)x->digits);
      #endif
      } /* h<=8  */

    /* apply postconditioning: a=a**(10**h) -- this is calculated  */
    /* at a slightly higher precision than Hull & Abrham suggest  */
    if (h>0) {
      Int seenbit=0;               /* set once a 1-bit is seen  */
      Int i;                       /* counter  */
      Int n=powers[h];             /* always positive  */
      aset.digits=p+2;             /* sufficient precision  */
      /* avoid the overhead and many extra digits of decNumberPower  */
      /* as all that is needed is the short 'multipliers' loop; here  */
      /* accumulate the answer into t  */
      uprv_decNumberZero(t); *t->lsu=1; /* acc=1  */
      for (i=1;;i++){              /* for each bit [top bit ignored]  */
        /* abandon if have had overflow or terminal underflow  */
        if (*status & (DEC_Overflow|DEC_Underflow)) { /* interesting?  */
          if (*status&DEC_Overflow || ISZERO(t)) break;}
        n=n<<1;                    /* move next bit to testable position  */
        if (n<0) {                 /* top bit is set  */
          seenbit=1;               /* OK, have a significant bit  */
          decMultiplyOp(t, t, a, &aset, status); /* acc=acc*x  */
          }
        if (i==31) break;          /* that was the last bit  */
        if (!seenbit) continue;    /* no need to square 1  */
        decMultiplyOp(t, t, t, &aset, status); /* acc=acc*acc [square]  */
        } /*i*/ /* 32 bits  */
      /* decNumberShow(t);  */
      a=t;                         /* and carry on using t instead of a  */
      }

    /* Copy and round the result to res  */
    residue=1;                          /* indicate dirt to right ..  */
    if (ISZERO(a)) residue=0;           /* .. unless underflowed to 0  */
    aset.digits=set->digits;            /* [use default rounding]  */
    decCopyFit(res, a, &aset, &residue, status); /* copy & shorten  */
    decFinish(res, set, &residue, status);       /* cleanup/set flags  */
    } while(0);                         /* end protected  */

  if (allocrhs !=NULL) free(allocrhs);  /* drop any storage used  */
  if (allocbufa!=NULL) free(allocbufa); /* ..  */
  if (allocbuft!=NULL) free(allocbuft); /* ..  */
  /* [status is handled by caller]  */
  return res;
  }